

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O1

int read_png(control *control)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  uint uVar10;
  png_structp png_ptr;
  png_infop info_ptr;
  int rc;
  long *local_50;
  long local_48;
  int local_3c;
  control *local_38;
  
  local_48 = 0;
  local_50 = (long *)png_create_read_struct("1.6.48.git",control,error_handler,warning_handler);
  if (local_50 == (long *)0x0) {
    if ((undefined1  [96])((undefined1  [96])*(control->file).global & (undefined1  [96])0x1) !=
        (undefined1  [96])0x0) {
      read_png_cold_3();
    }
    piVar1 = &(control->file).status_code;
    *(byte *)piVar1 = (byte)*piVar1 | 0x40;
    local_3c = 2;
  }
  else {
    local_3c = _setjmp((__jmp_buf_tag *)(control->file).jmpbuf);
    if (local_3c == 0) {
      png_set_user_limits(local_50,0x7fffffff);
      png_set_chunk_cache_max(local_50,0);
      png_set_chunk_malloc_max(local_50,0);
      png_set_read_fn(local_50,control,read_callback);
      local_48 = png_create_info_struct(local_50);
      if (local_48 == 0) {
        iVar3 = 0x10a6d8;
        plVar8 = local_50;
        png_error();
        lVar6 = plVar8[0x2a];
        if (iVar3 == 0) {
          if (plVar8[0x28] != 0) {
            __assert_fail("file->chunk == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0xdde,"void allocate(struct file *, int)");
          }
          lVar9 = -0x58;
          do {
            uVar10 = (clear_clear_seed_1 << 7 | clear_clear_seed_0 >> 0x19) ^
                     clear_clear_seed_0 >> 0xc;
            clear_clear_seed_1 = clear_clear_seed_1 << 8 | clear_clear_seed_0 >> 0x18;
            clear_clear_seed_0 = clear_clear_seed_0 << 8 | uVar10 & 0xff;
            *(char *)(lVar6 + 0x1b8 + lVar9) = (char)uVar10;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
          *(long **)(lVar6 + 0x160) = plVar8;
          *(long *)(lVar6 + 0x168) = *plVar8;
          lVar9 = plVar8[0x24];
          *(long *)(lVar6 + 400) = plVar8[0x23];
          *(long *)(lVar6 + 0x198) = lVar9;
          *(int *)(lVar6 + 0x1a0) = (int)plVar8[0x25];
          *(undefined4 *)(lVar6 + 0x1a4) = *(undefined4 *)((long)plVar8 + 300);
          *(undefined4 *)(lVar6 + 0x17c) = 0;
          *(undefined4 *)(lVar6 + 0x18c) = 0;
          plVar8[0x28] = lVar6 + 0x160;
        }
        else {
          if (plVar8[0x29] != 0) {
            __assert_fail("file->idat == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0xdd8,"void allocate(struct file *, int)");
          }
          if (plVar8[0x28] != 0) {
            __assert_fail("file->chunk == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0x6fd,"void IDAT_init(struct IDAT *const, struct file *const)");
          }
          lVar9 = lVar6 + 0x1b8;
          lVar7 = -0x38;
          do {
            uVar10 = (clear_clear_seed_1 << 7 | clear_clear_seed_0 >> 0x19) ^
                     clear_clear_seed_0 >> 0xc;
            clear_clear_seed_1 = clear_clear_seed_1 << 8 | clear_clear_seed_0 >> 0x18;
            clear_clear_seed_0 = clear_clear_seed_0 << 8 | uVar10 & 0xff;
            *(char *)(lVar6 + 0x1f0 + lVar7) = (char)uVar10;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0);
          *(long **)(lVar6 + 0x1b8) = plVar8;
          lVar7 = *plVar8;
          *(long *)(lVar6 + 0x1c0) = lVar7;
          *(undefined4 *)(lVar7 + 0x1c) = 0;
          *(long *)(lVar6 + 0x1d0) = lVar7 + 0x10;
          *(long *)(lVar6 + 0x1c8) = lVar7 + 0x10;
          lVar6 = (*(code *)plVar8[0x2b])(plVar8,0);
          if (plVar8[0x28] == 0) {
            __assert_fail("file->chunk != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                          ,0x70f,"void IDAT_init(struct IDAT *const, struct file *const)");
          }
          plVar8[0x29] = lVar9;
        }
        return (int)lVar6;
      }
      local_38 = control;
      if ((undefined1  [96])((undefined1  [96])*(control->file).global & (undefined1  [96])0xe0) !=
          (undefined1  [96])0x0) {
        read_png_cold_1();
      }
      png_read_info(local_50,local_48);
      iVar3 = png_get_image_height(local_50,local_48);
      iVar4 = png_set_interlace_handling(local_50);
      png_start_read_image(local_50);
      if (0 < iVar4) {
        iVar5 = 0;
        iVar2 = iVar3;
        do {
          for (; iVar2 != 0; iVar2 = iVar2 + -1) {
            png_read_row(local_50,0);
          }
          iVar5 = iVar5 + 1;
          iVar2 = iVar3;
        } while (iVar5 != iVar4);
      }
      if ((undefined1  [96])((undefined1  [96])*(local_38->file).global & (undefined1  [96])0xe0) !=
          (undefined1  [96])0x0) {
        read_png_cold_2();
      }
      png_read_end(local_50,local_48);
    }
    png_destroy_read_struct(&local_50,&local_48,0);
  }
  return local_3c;
}

Assistant:

static int
read_png(struct control *control)
   /* Read a PNG, return 0 on success else an error (status) code; a bit mask as
    * defined for file::status_code as above.
    */
{
   png_structp png_ptr;
   png_infop info_ptr = NULL;
   volatile int rc;

   png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, control,
      error_handler, warning_handler);

   if (png_ptr == NULL)
   {
      /* This is not really expected. */
      log_error(&control->file, LIBPNG_ERROR_CODE, "OOM allocating png_struct");
      control->file.status_code |= INTERNAL_ERROR;
      return LIBPNG_ERROR_CODE;
   }

   rc = setjmp(control->file.jmpbuf);
   if (rc == 0)
   {
#     ifdef PNG_SET_USER_LIMITS_SUPPORTED
         /* Remove any limits on the size of PNG files that can be read,
          * without this we may reject files based on built-in safety
          * limits.
          */
         png_set_user_limits(png_ptr, 0x7fffffff, 0x7fffffff);
         png_set_chunk_cache_max(png_ptr, 0);
         png_set_chunk_malloc_max(png_ptr, 0);
#     endif

      png_set_read_fn(png_ptr, control, read_callback);

      info_ptr = png_create_info_struct(png_ptr);
      if (info_ptr == NULL)
         png_error(png_ptr, "OOM allocating info structure");

      if (control->file.global->verbose)
         fprintf(stderr, " INFO\n");

      png_read_info(png_ptr, info_ptr);

      {
        png_uint_32 height = png_get_image_height(png_ptr, info_ptr);
        int passes = png_set_interlace_handling(png_ptr);
        int pass;

        png_start_read_image(png_ptr);

        for (pass = 0; pass < passes; ++pass)
        {
           png_uint_32 y = height;

           /* NOTE: this skips asking libpng to return either version of
            * the image row, but libpng still reads the rows.
            */
           while (y-- > 0)
              png_read_row(png_ptr, NULL, NULL);
        }
      }

      if (control->file.global->verbose)
         fprintf(stderr, " END\n");

      /* Make sure to read to the end of the file: */
      png_read_end(png_ptr, info_ptr);
   }

   png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
   return rc;
}